

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context_wrapper.cpp
# Opt level: O1

void __thiscall
duckdb::ClientContextWrapper::ClientContextWrapper
          (ClientContextWrapper *this,shared_ptr<duckdb::ClientContext,_true> *context)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  this->_vptr_ClientContextWrapper = (_func_int **)&PTR__ClientContextWrapper_024a6388;
  (this->client_context).internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (context->internal).super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  p_Var1 = (context->internal).super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->client_context).internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded != '\0') {
      p_Var1->_M_weak_count = p_Var1->_M_weak_count + 1;
      return;
    }
    LOCK();
    p_Var1->_M_weak_count = p_Var1->_M_weak_count + 1;
    UNLOCK();
  }
  return;
}

Assistant:

ClientContextWrapper::ClientContextWrapper(const shared_ptr<ClientContext> &context) : client_context(context) {
}